

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O0

int __thiscall QuadraticFunctor::operator()(QuadraticFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  code *pcVar6;
  int iVar7;
  CoeffReturnType pdVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  double yValue;
  double xValue;
  int i;
  double cParam;
  double bParam;
  double aParam;
  VectorXd *fvec_local;
  VectorXd *x_local;
  QuadraticFunctor *this_local;
  
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,0);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,1);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,2);
  dVar3 = *pdVar8;
  xValue._4_4_ = 0;
  while( true ) {
    iVar7 = values(this);
    if (iVar7 <= xValue._4_4_) break;
    pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        &this->measuredValues,(long)xValue._4_4_,0);
    dVar4 = *pdVar9;
    pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        &this->measuredValues,(long)xValue._4_4_,1);
    dVar5 = *pdVar9;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)fvec,
                         (long)xValue._4_4_);
    *pSVar10 = dVar5 - (dVar1 * dVar4 * dVar4 + dVar2 * dVar4 + dVar3);
    xValue._4_4_ = xValue._4_4_ + 1;
  }
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fvec' has dimensions m x 1
        // It will contain the error for each data point.

        double aParam = x(0);
        double bParam = x(1);
        double cParam = x(2);

        for (int i = 0; i < values(); i++)
        {
            double xValue = measuredValues(i, 0);
            double yValue = measuredValues(i, 1);

            fvec(i) = yValue - (aParam * xValue * xValue + bParam * xValue + cParam);
        }
    }